

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O0

QString * __thiscall QSqlTableModel::selectStatement(QSqlTableModel *this)

{
  QLatin1StringView latin1;
  bool bVar1;
  QSqlTableModelPrivate *databaseText;
  QSqlDriver *pQVar2;
  QString *in_RSI;
  QLatin1String *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar3;
  QSqlTableModelPrivate *d;
  QString stmt;
  QStringBuilder<QLatin1String,_const_QString_&> *in_stack_fffffffffffffe08;
  QLatin1String *str;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  undefined1 in_stack_fffffffffffffe30 [16];
  QString *driverText;
  QLatin1String *this_00;
  undefined1 local_1a8 [120];
  QLatin1StringView local_130;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  QLatin1StringView local_a0;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  str = in_RDI;
  driverText = in_RSI;
  this_00 = in_RDI;
  databaseText = d_func((QSqlTableModel *)0x16f782);
  bVar1 = QString::isEmpty((QString *)0x16f798);
  if (bVar1) {
    QVar3 = Qt::Literals::StringLiterals::operator____L1((char *)str,(size_t)in_RDI);
    latin1.m_data = (char *)driverText;
    latin1.m_size = (qsizetype)databaseText;
    QString::QString(in_RSI,latin1);
    QString::QString((QString *)0x16f7e0);
    QString::QString((QString *)0x16f7ed);
    QSqlError::QSqlError
              ((QSqlError *)this_00,driverText,(QString *)databaseText,QVar3.m_data._4_4_,
               (QString *)QVar3.m_size);
    QSqlError::operator=((QSqlError *)in_RDI,(QSqlError *)in_stack_fffffffffffffe08);
    QSqlError::~QSqlError((QSqlError *)0x16f83d);
    QString::~QString((QString *)0x16f84a);
    QString::~QString((QString *)0x16f857);
    QString::~QString((QString *)0x16f864);
    QString::QString((QString *)0x16f86e);
  }
  else {
    bVar1 = QSqlRecord::isEmpty((QSqlRecord *)0x16f884);
    if (bVar1) {
      local_a0 = Qt::Literals::StringLiterals::operator____L1((char *)str,(size_t)in_RDI);
      ::operator+(in_RDI,(QString *)in_stack_fffffffffffffe08);
      ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffe08);
      QString::QString((QString *)0x16f8f1);
      QString::QString((QString *)0x16f8fe);
      QSqlError::QSqlError
                ((QSqlError *)this_00,driverText,(QString *)databaseText,
                 in_stack_fffffffffffffe30._12_4_,in_stack_fffffffffffffe30._0_8_);
      QSqlError::operator=((QSqlError *)in_RDI,(QSqlError *)in_stack_fffffffffffffe08);
      QSqlError::~QSqlError((QSqlError *)0x16f94e);
      QString::~QString((QString *)0x16f95b);
      QString::~QString((QString *)0x16f968);
      QString::~QString((QString *)0x16f975);
      QString::QString((QString *)0x16f97f);
    }
    else {
      local_e8 = 0xaaaaaaaaaaaaaaaa;
      local_e0 = 0xaaaaaaaaaaaaaaaa;
      local_d8 = 0xaaaaaaaaaaaaaaaa;
      pQVar2 = QSqlDatabase::driver(&databaseText->db);
      (**(code **)(*(long *)pQVar2 + 0xa8))
                (&local_e8,pQVar2,1,&databaseText->tableName,
                 &(databaseText->super_QSqlQueryModelPrivate).rec,0);
      bVar1 = QString::isEmpty((QString *)0x16fa03);
      if (bVar1) {
        local_130 = Qt::Literals::StringLiterals::operator____L1((char *)str,(size_t)in_RDI);
        ::operator+(in_RDI,(QString *)in_stack_fffffffffffffe08);
        ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffe08);
        QString::QString((QString *)0x16fa70);
        QString::QString((QString *)0x16fa7d);
        QSqlError::QSqlError
                  ((QSqlError *)this_00,driverText,(QString *)databaseText,
                   in_stack_fffffffffffffe30._12_4_,in_stack_fffffffffffffe30._0_8_);
        QSqlError::operator=((QSqlError *)in_RDI,(QSqlError *)in_stack_fffffffffffffe08);
        QSqlError::~QSqlError((QSqlError *)0x16facd);
        QString::~QString((QString *)0x16fada);
        QString::~QString((QString *)0x16fae7);
        QString::~QString((QString *)0x16faf4);
        QString::QString((QString *)in_RDI,(QString *)in_stack_fffffffffffffe08);
      }
      else {
        QSqlQueryModelSql::where
                  ((QString *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        QSqlQueryModelSql::concat(driverText,(QString *)databaseText);
        (**(code **)&(in_RSI->d).d[0x1f].super_QArrayData)(local_1a8);
        QSqlQueryModelSql::concat(driverText,(QString *)databaseText);
        QString::~QString((QString *)0x16fb77);
        QString::~QString((QString *)0x16fb84);
        QString::~QString((QString *)0x16fb8e);
      }
      QString::~QString((QString *)0x16fba3);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)str;
  }
  __stack_chk_fail();
}

Assistant:

QString QSqlTableModel::selectStatement() const
{
    Q_D(const QSqlTableModel);
    if (d->tableName.isEmpty()) {
        d->error = QSqlError("No table name given"_L1, QString(), QSqlError::StatementError);
        return QString();
    }
    if (d->rec.isEmpty()) {
        d->error = QSqlError("Unable to find table "_L1 + d->tableName, QString(),
                             QSqlError::StatementError);
        return QString();
    }

    const QString stmt = d->db.driver()->sqlStatement(QSqlDriver::SelectStatement,
                                                      d->tableName,
                                                      d->rec,
                                                      false);
    if (stmt.isEmpty()) {
        d->error = QSqlError("Unable to select fields from table "_L1 + d->tableName,
                             QString(), QSqlError::StatementError);
        return stmt;
    }
    return SqlTm::concat(SqlTm::concat(stmt, SqlTm::where(d->filter)), orderByClause());
}